

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# steal_buf.h
# Opt level: O0

int __thiscall
cppcms::util::filterbuf<test_app::upperA,_16>::overflow(filterbuf<test_app::upperA,_16> *this,int c)

{
  ssize_t sVar1;
  undefined1 *puVar2;
  undefined1 in_CL;
  undefined7 in_register_00000009;
  void *in_RDX;
  int in_ESI;
  filterbuf<test_app::upperA,_16> *in_RDI;
  undefined4 local_4;
  
  sVar1 = write(in_RDI,in_ESI,in_RDX,CONCAT71(in_register_00000009,in_CL));
  if ((int)sVar1 == 0) {
    if (in_ESI != -1) {
      puVar2 = (undefined1 *)std::streambuf::pptr();
      *puVar2 = (char)in_ESI;
      std::streambuf::pbump((int)in_RDI);
    }
    local_4 = 0;
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int overflow(int c)
		{
			if(write()!=0)
				return -1;
			if(c!=EOF) {
				*pptr()=c;
				pbump(1);
			}
			return 0;
		}